

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullWriter.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::NullWriter::NullWriter
          (NullWriter *this,IO *io,string *name,Mode mode,Comm *comm)

{
  NullWriterImpl *this_00;
  undefined4 in_ECX;
  undefined8 *in_RDI;
  string *in_R8;
  Comm *in_stack_ffffffffffffff58;
  pointer __p;
  Comm *in_stack_ffffffffffffff60;
  allocator local_49;
  Comm *in_stack_ffffffffffffffb8;
  Mode in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  IO *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"NullWriter",&local_49);
  helper::Comm::Comm(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Engine::Engine((Engine *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                 in_stack_ffffffffffffffb8);
  helper::Comm::~Comm((Comm *)0xac780c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  *in_RDI = &PTR__NullWriter_01131ce8;
  __p = (pointer)(in_RDI + 0x18);
  this_00 = (NullWriterImpl *)operator_new(0x10);
  NullWriterImpl::NullWriterImpl(this_00);
  std::
  unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>>
  ::unique_ptr<std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>,void>
            ((unique_ptr<adios2::core::engine::NullWriter::NullWriterImpl,_std::default_delete<adios2::core::engine::NullWriter::NullWriterImpl>_>
              *)this_00,__p);
  *(undefined1 *)(in_RDI + 0x10) = 1;
  return;
}

Assistant:

NullWriter::NullWriter(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("NullWriter", io, name, mode, std::move(comm)), Impl(new NullWriter::NullWriterImpl)
{
    m_IsOpen = true;
}